

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

void anon_unknown.dwarf_10ab391::PrintCallStack
               (ostream *out,cmListFileBacktrace *bt,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *topSource)

{
  bool bVar1;
  cmListFileContext *pcVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *top;
  ostream *poVar4;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_f0;
  string local_e0;
  undefined4 local_ac;
  undefined1 local_a8 [8];
  cmListFileContext lfc;
  undefined1 local_30 [7];
  bool first;
  optional *local_20;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *topSource_local;
  cmListFileBacktrace *bt_local;
  ostream *out_local;
  
  local_20 = (optional *)topSource;
  topSource_local =
       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )bt;
  bt_local = (cmListFileBacktrace *)out;
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar1) {
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_30);
    cmListFileBacktrace::operator=(bt,(cmListFileBacktrace *)local_30);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
    bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                      (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    if (!bVar1) {
      lfc.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._39_1_ = 1;
      while (bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                               (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        pcVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                           (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
        cmListFileContext::cmListFileContext((cmListFileContext *)local_a8,pcVar2);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) || (lfc.FilePath.field_2._8_8_ == -1)) {
          if ((lfc.DeferId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._39_1_ & 1) != 0) {
            lfc.DeferId.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._39_1_ = 0;
            std::operator<<((ostream *)bt_local,"Call Stack (most recent call first):\n");
          }
          bVar1 = std::optional::operator_cast_to_bool(local_20);
          if (bVar1) {
            top = std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_20);
            cmSystemTools::RelativeIfUnder(&local_e0,top,(string *)((long)&lfc.Name.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
          }
          poVar4 = std::operator<<((ostream *)bt_local,"  ");
          poVar4 = ::operator<<(poVar4,(cmListFileContext *)local_a8);
          std::operator<<(poVar4,"\n");
          local_ac = 0;
        }
        else {
          local_ac = 4;
        }
        cmListFileContext::~cmListFileContext((cmListFileContext *)local_a8);
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop(&local_f0);
        cmListFileBacktrace::operator=(bt,(cmListFileBacktrace *)&local_f0);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_f0);
      }
    }
  }
  return;
}

Assistant:

void PrintCallStack(std::ostream& out, cmListFileBacktrace bt,
                    cm::optional<std::string> const& topSource)
{
  // The call stack exists only if we have at least two calls on top
  // of the bottom.
  if (bt.Empty()) {
    return;
  }
  bt = bt.Pop();
  if (bt.Empty()) {
    return;
  }

  bool first = true;
  for (; !bt.Empty(); bt = bt.Pop()) {
    cmListFileContext lfc = bt.Top();
    if (lfc.Name.empty() &&
        lfc.Line != cmListFileContext::DeferPlaceholderLine) {
      // Skip this whole-file scope.  When we get here we already will
      // have printed a more-specific context within the file.
      continue;
    }
    if (first) {
      first = false;
      out << "Call Stack (most recent call first):\n";
    }
    if (topSource) {
      lfc.FilePath = cmSystemTools::RelativeIfUnder(*topSource, lfc.FilePath);
    }
    out << "  " << lfc << "\n";
  }
}